

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

int SSL_ECH_KEYS_marshal_retry_configs(SSL_ECH_KEYS *keys,uint8_t **out,size_t *out_len)

{
  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *this;
  bool bVar1;
  int iVar2;
  cbb_st *pcVar3;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *puVar4;
  pointer pEVar5;
  ECHConfig *pEVar6;
  uchar *data;
  size_t len;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *config;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *__end1;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *__begin1;
  Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_> *__range1;
  undefined1 local_88 [8];
  CBB child;
  ScopedCBB cbb;
  size_t *out_len_local;
  uint8_t **out_local;
  SSL_ECH_KEYS *keys_local;
  
  this = (StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&child.u + 0x18);
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated(this);
  pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get(this);
  iVar2 = CBB_init(pcVar3,0x80);
  if (iVar2 != 0) {
    pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&child.u + 0x18));
    iVar2 = CBB_add_u16_length_prefixed(pcVar3,(CBB *)local_88);
    if (iVar2 != 0) {
      __end1 = bssl::Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_>::begin
                         (&keys->configs);
      puVar4 = bssl::Vector<std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>_>::end
                         (&keys->configs);
      for (; __end1 != puVar4; __end1 = __end1 + 1) {
        pEVar5 = std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::operator->(__end1)
        ;
        bVar1 = bssl::ECHServerConfig::is_retry_config(pEVar5);
        if (bVar1) {
          pEVar5 = std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::operator->
                             (__end1);
          pEVar6 = bssl::ECHServerConfig::ech_config(pEVar5);
          data = bssl::Array<unsigned_char>::data(&pEVar6->raw);
          pEVar5 = std::unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter>::operator->
                             (__end1);
          pEVar6 = bssl::ECHServerConfig::ech_config(pEVar5);
          len = bssl::Array<unsigned_char>::size(&pEVar6->raw);
          iVar2 = CBB_add_bytes((CBB *)local_88,data,len);
          if (iVar2 == 0) {
            keys_local._4_4_ = 0;
            goto LAB_001621a8;
          }
        }
      }
      pcVar3 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                          ((long)&child.u + 0x18));
      keys_local._4_4_ = CBB_finish(pcVar3,out,out_len);
      goto LAB_001621a8;
    }
  }
  keys_local._4_4_ = 0;
LAB_001621a8:
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&child.u + 0x18));
  return keys_local._4_4_;
}

Assistant:

int SSL_ECH_KEYS_marshal_retry_configs(const SSL_ECH_KEYS *keys, uint8_t **out,
                                       size_t *out_len) {
  ScopedCBB cbb;
  CBB child;
  if (!CBB_init(cbb.get(), 128) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &child)) {
    return false;
  }
  for (const auto &config : keys->configs) {
    if (config->is_retry_config() &&
        !CBB_add_bytes(&child, config->ech_config().raw.data(),
                       config->ech_config().raw.size())) {
      return false;
    }
  }
  return CBB_finish(cbb.get(), out, out_len);
}